

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<tinyusdz::Reference>
          (CrateReader *this,vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *d)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  size_t i;
  uint64_t n;
  ostringstream ss_e;
  uint64_t local_1c0 [5];
  Reference local_198;
  
  if (d == (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)0x0) {
    return false;
  }
  local_1c0[0] = 0;
  bVar1 = StreamReader::read8(this->_sr,local_1c0);
  if (bVar1) {
    if ((this->_config).maxArrayElements < local_1c0[0]) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      poVar2 = ::std::operator<<((ostream *)&local_198,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x5f2);
      ::std::operator<<(poVar2," ");
      pcVar4 = "Too many array elements.";
    }
    else {
      uVar3 = local_1c0[0] * 0x150 + this->_memoryUsage;
      this->_memoryUsage = uVar3;
      if (uVar3 <= (this->_config).maxMemoryBudget) {
        uVar3 = 0;
        while( true ) {
          if (local_1c0[0] <= uVar3) {
            return true;
          }
          Reference::Reference(&local_198);
          bVar1 = ReadReference(this,&local_198);
          if (!bVar1) break;
          ::std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>::
          emplace_back<tinyusdz::Reference&>
                    ((vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>> *)d,&local_198
                    );
          Reference::~Reference(&local_198);
          uVar3 = uVar3 + 1;
        }
        Reference::~Reference(&local_198);
        return false;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      poVar2 = ::std::operator<<((ostream *)&local_198,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x5f5);
      ::std::operator<<(poVar2," ");
      pcVar4 = "Reached to max memory budget.";
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    poVar2 = ::std::operator<<((ostream *)&local_198,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadArray");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x5ed);
    ::std::operator<<(poVar2," ");
    pcVar4 = "Failed to read the number of array elements.";
  }
  poVar2 = ::std::operator<<((ostream *)&local_198,pcVar4);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return false;
}

Assistant:

bool CrateReader::ReadArray(std::vector<Reference> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (!_sr->read8(&n)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    return false;
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(Reference) * n);

  for (size_t i = 0; i < n; i++) {
    Reference p;
    if (!ReadReference(&p)) {
      return false;
    }
    d->emplace_back(p);
  }

  return true;
}